

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

void Kit_TruthPrintProfile_int(uint *pTruth,int nVars)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *pBytesInit;
  uint *pOut;
  uint *pOut_00;
  uint *pOut_01;
  uint *pOut_02;
  uint *pOut_03;
  uint uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint *puVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int *piVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  int Unique1 [20];
  int Mints1 [20];
  int Mints0 [20];
  int Mints [20];
  int Common2 [20] [20];
  int Unique2 [20] [20];
  int Total2 [20] [20];
  uint *local_14f0;
  uint auStack_1438 [20];
  int local_13e8 [20];
  int local_1398 [20];
  uint local_1348 [20];
  int local_12f8 [400];
  int local_cb8 [400];
  int local_678 [402];
  
  uVar12 = (ulong)(uint)nVars;
  uVar8 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar8 = 1;
  }
  pBytesInit = (int *)malloc((long)(int)(uVar8 * 4) << 2);
  sVar10 = (long)(int)uVar8 << 2;
  pOut = (uint *)malloc(sVar10);
  local_14f0 = (uint *)malloc(sVar10);
  pOut_00 = (uint *)malloc(sVar10);
  pOut_01 = (uint *)malloc(sVar10);
  pOut_02 = (uint *)malloc(sVar10);
  pOut_03 = (uint *)malloc(sVar10);
  if (0x14 < nVars) {
    __assert_fail("nVars <= 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x803,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
  }
  if (nVars < 6) {
    __assert_fail("nVars >= 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x804,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
  }
  iVar2 = Kit_TruthCountMinterms(pTruth,nVars,(int *)local_1348,pBytesInit);
  uVar11 = 0;
  do {
    uVar3 = Kit_TruthBooleanDiffCount(pTruth,nVars,(int)uVar11);
    auStack_1438[uVar11] = uVar3;
    uVar11 = uVar11 + 1;
  } while (uVar12 != uVar11);
  sVar10 = uVar12 * 4;
  lVar20 = 0;
  do {
    memset((void *)((long)local_12f8 + lVar20),0xff,sVar10);
    memset((void *)((long)local_cb8 + lVar20),0xff,sVar10);
    memset((void *)((long)local_678 + lVar20),0xff,sVar10);
    lVar20 = lVar20 + 0x50;
  } while (uVar12 * 0x50 != lVar20);
  iVar4 = 1 << ((char)nVars - 2U & 0x1f);
  uVar3 = nVars - 1;
  uVar11 = 1;
  if (1 < (int)uVar3) {
    uVar11 = (ulong)uVar3;
  }
  uVar24 = 1;
  if (1 < nVars) {
    uVar24 = uVar12;
  }
  uVar22 = 0;
  do {
    lVar20 = (ulong)uVar8 + 1;
    if (0 < (int)uVar8) {
      do {
        pOut[lVar20 + -2] = pTruth[lVar20 + -2];
        lVar20 = lVar20 + -1;
      } while (1 < lVar20);
    }
    if ((long)uVar22 < (long)(int)uVar3) {
      uVar23 = uVar22 & 0xffffffff;
      puVar15 = pOut;
      do {
        pOut = local_14f0;
        local_14f0 = puVar15;
        Kit_TruthSwapAdjacentVars(pOut,local_14f0,nVars,(int)uVar23);
        uVar25 = (int)uVar23 + 1;
        uVar23 = (ulong)uVar25;
        puVar15 = pOut;
      } while (uVar3 != uVar25);
    }
    iVar5 = Kit_TruthCountMinterms(pOut,uVar3,local_1398,pBytesInit);
    puVar15 = pOut + (int)uVar8 / 2;
    iVar6 = Kit_TruthCountMinterms(puVar15,uVar3,local_13e8,pBytesInit);
    if (iVar2 != iVar6 + iVar5) {
      __assert_fail("nTotalMints == nTotalMints0 + nTotalMints1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                    ,0x820,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
    }
    uVar23 = 0;
    do {
      uVar1 = uVar23 + 1;
      uVar9 = uVar1;
      if (uVar23 < uVar22) {
        uVar9 = uVar23;
      }
      if (uVar22 == (uVar9 & 0xffffffff)) {
        __assert_fail("v != iVar",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x830,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      uVar25 = local_1348[uVar23 - 0x14];
      if (((int)uVar25 < 0) || (iVar4 < (int)uVar25)) {
        __assert_fail("Cof00 >= 0 && Cof00 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x837,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar13 = iVar5 - uVar25;
      if ((iVar13 < 0) || (iVar4 < iVar13)) {
        __assert_fail("Cof01 >= 0 && Cof01 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x838,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar7 = local_13e8[uVar23];
      if ((iVar7 < 0) || (iVar4 < iVar7)) {
        __assert_fail("Cof10 >= 0 && Cof10 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x839,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar14 = iVar6 - iVar7;
      if ((iVar14 < 0) || (iVar4 < iVar14)) {
        __assert_fail("Cof11 >= 0 && Cof11 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83a,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar16 = iVar4 - uVar25;
      if (iVar16 < 0) {
        __assert_fail("Coz00 >= 0 && Coz00 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83c,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar18 = iVar4 - iVar13;
      if (iVar18 < 0) {
        __assert_fail("Coz01 >= 0 && Coz01 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83d,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar17 = iVar4 - iVar7;
      if (iVar17 < 0) {
        __assert_fail("Coz10 >= 0 && Coz10 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83e,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar19 = iVar4 - iVar14;
      if (iVar19 < 0) {
        __assert_fail("Coz11 >= 0 && Coz11 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83f,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar26 = iVar18 * iVar7 + iVar17 * iVar13 + iVar14 * iVar16 + iVar19 * uVar25;
      uVar9 = uVar9 & 0xffffffff;
      local_12f8[uVar9 * 0x14 + uVar22] = iVar26;
      local_12f8[uVar22 * 0x14 + uVar9] = iVar26;
      iVar13 = (iVar7 + iVar13) * iVar16 + iVar19 * (iVar7 + iVar13) + iVar14 * (iVar17 + iVar18) +
               iVar26 + (iVar17 + iVar18) * uVar25;
      local_678[uVar9 * 0x14 + uVar22] = iVar13;
      local_678[uVar22 * 0x14 + uVar9] = iVar13;
      iVar13 = (int)uVar1 + -1;
      Kit_TruthCofactor0New(pOut_00,pOut,uVar3,iVar13);
      Kit_TruthCofactor1New(pOut_01,pOut,uVar3,iVar13);
      Kit_TruthCofactor0New(pOut_02,puVar15,uVar3,iVar13);
      Kit_TruthCofactor1New(pOut_03,puVar15,uVar3,iVar13);
      iVar13 = Kit_TruthXorCount(pOut_00,pOut_01,uVar3);
      iVar7 = Kit_TruthXorCount(pOut_00,pOut_02,uVar3);
      iVar14 = Kit_TruthXorCount(pOut_00,pOut_03,uVar3);
      iVar16 = Kit_TruthXorCount(pOut_01,pOut_02,uVar3);
      iVar18 = Kit_TruthXorCount(pOut_01,pOut_03,uVar3);
      iVar17 = Kit_TruthXorCount(pOut_02,pOut_03,uVar3);
      iVar13 = iVar17 + iVar18 + iVar16 + iVar14 + iVar7 + iVar13;
      local_cb8[uVar9 * 0x14 + uVar22] = iVar13;
      local_cb8[uVar22 * 0x14 + uVar9] = iVar13;
      uVar23 = uVar1;
    } while (uVar1 != uVar11);
    uVar22 = uVar22 + 1;
    if (uVar22 == uVar24) {
      putchar(10);
      printf(" V: ");
      uVar8 = 0x61;
      do {
        printf("%8c  ",(ulong)uVar8);
        iVar2 = uVar8 - (int)uVar24;
        uVar8 = uVar8 + 1;
      } while (iVar2 != 0x60);
      putchar(10);
      printf(" M: ");
      uVar11 = 0;
      do {
        printf("%8d  ",(ulong)local_1348[uVar11]);
        uVar11 = uVar11 + 1;
      } while (uVar24 != uVar11);
      putchar(10);
      printf(" U: ");
      uVar11 = 0;
      do {
        printf("%8d  ",(ulong)auStack_1438[uVar11]);
        uVar11 = uVar11 + 1;
      } while (uVar24 != uVar11);
      putchar(10);
      putchar(10);
      puts("Unique:");
      uVar11 = 1;
      if (1 < nVars) {
        uVar11 = uVar12;
      }
      piVar21 = local_cb8;
      uVar22 = 0;
      do {
        printf(" %2d ",uVar22 & 0xffffffff);
        uVar23 = 0;
        do {
          printf("%8d  ",(ulong)(uint)piVar21[uVar23]);
          uVar23 = uVar23 + 1;
        } while (uVar24 != uVar23);
        putchar(10);
        uVar22 = uVar22 + 1;
        piVar21 = piVar21 + 0x14;
      } while (uVar22 != uVar11);
      puts("Common:");
      uVar11 = 1;
      if (1 < nVars) {
        uVar11 = uVar12;
      }
      piVar21 = local_12f8;
      uVar22 = 0;
      do {
        printf(" %2d ",uVar22 & 0xffffffff);
        uVar23 = 0;
        do {
          printf("%8d  ",(ulong)(uint)piVar21[uVar23]);
          uVar23 = uVar23 + 1;
        } while (uVar24 != uVar23);
        putchar(10);
        uVar22 = uVar22 + 1;
        piVar21 = piVar21 + 0x14;
      } while (uVar22 != uVar11);
      puts("Total:");
      uVar11 = 1;
      if (1 < nVars) {
        uVar11 = uVar12;
      }
      piVar21 = local_678;
      uVar12 = 0;
      do {
        printf(" %2d ",uVar12 & 0xffffffff);
        uVar24 = 0;
        do {
          printf("%8d  ",(ulong)(uint)piVar21[uVar24]);
          uVar24 = uVar24 + 1;
        } while (uVar11 != uVar24);
        putchar(10);
        uVar12 = uVar12 + 1;
        piVar21 = piVar21 + 0x14;
      } while (uVar12 != uVar11);
      if (pOut != (uint *)0x0) {
        free(pOut);
      }
      if (local_14f0 != (uint *)0x0) {
        free(local_14f0);
      }
      if (pOut_00 != (uint *)0x0) {
        free(pOut_00);
      }
      if (pOut_01 != (uint *)0x0) {
        free(pOut_01);
      }
      if (pOut_02 != (uint *)0x0) {
        free(pOut_02);
      }
      if (pOut_03 != (uint *)0x0) {
        free(pOut_03);
      }
      if (pBytesInit == (int *)0x0) {
        return;
      }
      free(pBytesInit);
      return;
    }
  } while( true );
}

Assistant:

void Kit_TruthPrintProfile_int( unsigned * pTruth, int nVars )
{
    int Mints[20];
    int Mints0[20];
    int Mints1[20];
    int Unique1[20];
    int Total2[20][20];
    int Unique2[20][20];
    int Common2[20][20];
    int nWords = Kit_TruthWordNum( nVars );
    int * pBytes    = ABC_ALLOC( int, nWords * 4 );
    unsigned * pIn  = ABC_ALLOC( unsigned, nWords );
    unsigned * pOut = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof00 = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof01 = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof10 = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof11 = ABC_ALLOC( unsigned, nWords );
    unsigned * pTemp;
    int nTotalMints, nTotalMints0, nTotalMints1;
    int v, u, i, iVar, nMints1;
    int Cof00, Cof01, Cof10, Cof11;
    int Coz00, Coz01, Coz10, Coz11;
    assert( nVars <= 20 );
    assert( nVars >=  6 );

    nTotalMints = Kit_TruthCountMinterms( pTruth, nVars, Mints, pBytes );
    for ( v = 0; v < nVars; v++ )
        Unique1[v] = Kit_TruthBooleanDiffCount( pTruth, nVars, v );

    for ( v = 0; v < nVars; v++ )
    for ( u = 0; u < nVars; u++ )
        Total2[v][u] = Unique2[v][u] = Common2[v][u] = -1;

    nMints1 = (1<<(nVars-2));
    for ( v = 0; v < nVars; v++ )
    {
        // move this var to be the first
        Kit_TruthCopy( pIn, pTruth, nVars );
//        Extra_PrintBinary( stdout, pIn, (1<<nVars) ); printf( "\n" );
        for ( i = v; i < nVars - 1; i++ )
        {
            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
//        Extra_PrintBinary( stdout, pIn, (1<<nVars) ); printf( "\n" );
//        printf( "\n" );


        // count minterms in both cofactor
        nTotalMints0 = Kit_TruthCountMinterms( pIn,          nVars-1, Mints0, pBytes );
        nTotalMints1 = Kit_TruthCountMinterms( pIn+nWords/2, nVars-1, Mints1, pBytes );
        assert( nTotalMints == nTotalMints0 + nTotalMints1 );
/*
        for ( u = 0; u < nVars-1; u++ )
            printf( "%2d ", Mints0[u] );
        printf( "\n" );

        for ( u = 0; u < nVars-1; u++ )
            printf( "%2d ", Mints1[u] );
        printf( "\n" );
*/
        for ( u = 0; u < nVars-1; u++ )
        {
            if ( u < v )
                iVar = u;
            else 
                iVar = u + 1;
            assert( v != iVar );
            // get minter counts in the cofactors
            Cof00 =              Mints0[u]; Coz00 = nMints1 - Cof00;              
            Cof01 = nTotalMints0-Mints0[u]; Coz01 = nMints1 - Cof01;
            Cof10 =              Mints1[u]; Coz10 = nMints1 - Cof10;
            Cof11 = nTotalMints1-Mints1[u]; Coz11 = nMints1 - Cof11;

            assert( Cof00 >= 0 && Cof00 <= nMints1 );
            assert( Cof01 >= 0 && Cof01 <= nMints1 );
            assert( Cof10 >= 0 && Cof10 <= nMints1 );
            assert( Cof11 >= 0 && Cof11 <= nMints1 );

            assert( Coz00 >= 0 && Coz00 <= nMints1 );
            assert( Coz01 >= 0 && Coz01 <= nMints1 );
            assert( Coz10 >= 0 && Coz10 <= nMints1 );
            assert( Coz11 >= 0 && Coz11 <= nMints1 );

            Common2[v][iVar] = Common2[iVar][v] = Cof00 * Coz11 + Coz00 * Cof11 + Cof01 * Coz10 + Coz01 * Cof10;

            Total2[v][iVar] = Total2[iVar][v] = 
                Cof00 * Coz01 + Coz00 * Cof01 + 
                Cof00 * Coz10 + Coz00 * Cof10 + 
                Cof00 * Coz11 + Coz00 * Cof11 + 
                Cof01 * Coz10 + Coz01 * Cof10 + 
                Cof01 * Coz11 + Coz01 * Cof11 + 
                Cof10 * Coz11 + Coz10 * Cof11 ;

            
            Kit_TruthCofactor0New( pCof00, pIn,          nVars-1, u );
            Kit_TruthCofactor1New( pCof01, pIn,          nVars-1, u );
            Kit_TruthCofactor0New( pCof10, pIn+nWords/2, nVars-1, u );
            Kit_TruthCofactor1New( pCof11, pIn+nWords/2, nVars-1, u );

            Unique2[v][iVar] = Unique2[iVar][v] = 
                Kit_TruthXorCount( pCof00, pCof01, nVars-1 ) +
                Kit_TruthXorCount( pCof00, pCof10, nVars-1 ) +
                Kit_TruthXorCount( pCof00, pCof11, nVars-1 ) +
                Kit_TruthXorCount( pCof01, pCof10, nVars-1 ) +
                Kit_TruthXorCount( pCof01, pCof11, nVars-1 ) +
                Kit_TruthXorCount( pCof10, pCof11, nVars-1 );
        }
    }

    printf( "\n" );
    printf( " V: " );
    for ( v = 0; v < nVars; v++ )
        printf( "%8c  ", v+'a' );
    printf( "\n" );

    printf( " M: " );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Mints[v] );
    printf( "\n" );

    printf( " U: " );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Unique1[v] );
    printf( "\n" );
    printf( "\n" );

    printf( "Unique:\n" );
    for ( i = 0; i < nVars; i++ )
    {
    printf( " %2d ", i );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Unique2[i][v] );
    printf( "\n" );
    }

    printf( "Common:\n" );
    for ( i = 0; i < nVars; i++ )
    {
    printf( " %2d ", i );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Common2[i][v] );
    printf( "\n" );
    }

    printf( "Total:\n" );
    for ( i = 0; i < nVars; i++ )
    {
    printf( " %2d ", i );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Total2[i][v] );
    printf( "\n" );
    }

    ABC_FREE( pIn );
    ABC_FREE( pOut );
    ABC_FREE( pCof00 );
    ABC_FREE( pCof01 );
    ABC_FREE( pCof10 );
    ABC_FREE( pCof11 );
    ABC_FREE( pBytes );
}